

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasreaditemcompressed_v1.cpp
# Opt level: O0

ssize_t __thiscall
LASreadItemCompressed_GPSTIME11_v1::read
          (LASreadItemCompressed_GPSTIME11_v1 *this,int __fd,void *__buf,size_t __nbytes)

{
  U32 UVar1;
  I32 IVar2;
  U64 UVar3;
  undefined4 in_register_00000034;
  int local_28;
  I32 gpstime_diff;
  I32 multi;
  U32 *context_local;
  U8 *item_local;
  LASreadItemCompressed_GPSTIME11_v1 *this_local;
  
  if (this->last_gpstime_diff == 0) {
    UVar1 = ArithmeticDecoder::decodeSymbol(this->dec,this->m_gpstime_0diff);
    if (UVar1 == 1) {
      IVar2 = IntegerCompressor::decompress(this->ic_gpstime,0,0);
      this->last_gpstime_diff = IVar2;
      (this->last_gpstime).u64 = (long)this->last_gpstime_diff + (this->last_gpstime).u64;
    }
    else if (UVar1 == 2) {
      UVar3 = ArithmeticDecoder::readInt64(this->dec);
      (this->last_gpstime).u64 = UVar3;
    }
  }
  else {
    UVar1 = ArithmeticDecoder::decodeSymbol(this->dec,this->m_gpstime_multi);
    if ((int)UVar1 < 0x1fe) {
      if (UVar1 == 1) {
        local_28 = IntegerCompressor::decompress(this->ic_gpstime,this->last_gpstime_diff,1);
        this->last_gpstime_diff = local_28;
        this->multi_extreme_counter = 0;
      }
      else if (UVar1 == 0) {
        local_28 = IntegerCompressor::decompress(this->ic_gpstime,this->last_gpstime_diff / 4,2);
        this->multi_extreme_counter = this->multi_extreme_counter + 1;
        if (3 < this->multi_extreme_counter) {
          this->last_gpstime_diff = local_28;
          this->multi_extreme_counter = 0;
        }
      }
      else if ((int)UVar1 < 10) {
        local_28 = IntegerCompressor::decompress(this->ic_gpstime,UVar1 * this->last_gpstime_diff,3)
        ;
      }
      else if ((int)UVar1 < 0x32) {
        local_28 = IntegerCompressor::decompress(this->ic_gpstime,UVar1 * this->last_gpstime_diff,4)
        ;
      }
      else {
        local_28 = IntegerCompressor::decompress(this->ic_gpstime,UVar1 * this->last_gpstime_diff,5)
        ;
        if ((UVar1 == 0x1fd) &&
           (this->multi_extreme_counter = this->multi_extreme_counter + 1,
           3 < this->multi_extreme_counter)) {
          this->last_gpstime_diff = local_28;
          this->multi_extreme_counter = 0;
        }
      }
      (this->last_gpstime).u64 = (long)local_28 + (this->last_gpstime).u64;
    }
    else if ((int)UVar1 < 0x1ff) {
      UVar3 = ArithmeticDecoder::readInt64(this->dec);
      (this->last_gpstime).u64 = UVar3;
    }
  }
  *(U64I64F64 *)CONCAT44(in_register_00000034,__fd) = this->last_gpstime;
  return (ssize_t)(U64I64F64 *)CONCAT44(in_register_00000034,__fd);
}

Assistant:

inline void LASreadItemCompressed_GPSTIME11_v1::read(U8* item, U32& context)
{
  I32 multi;
  if (last_gpstime_diff == 0) // if the last integer difference was zero
  {
    multi = dec->decodeSymbol(m_gpstime_0diff);
    if (multi == 1) // the difference can be represented with 32 bits
    {
      last_gpstime_diff = ic_gpstime->decompress(0, 0);
      last_gpstime.i64 += last_gpstime_diff;      
    }
    else if (multi == 2) // the difference is huge
    {
      last_gpstime.u64 = dec->readInt64();
    }
  }
  else
  {
    multi = dec->decodeSymbol(m_gpstime_multi);

    if (multi <  LASZIP_GPSTIME_MULTIMAX-2)
    {
      I32 gpstime_diff;
      if (multi == 1)
      {
        gpstime_diff = ic_gpstime->decompress(last_gpstime_diff, 1);
        last_gpstime_diff = gpstime_diff;
        multi_extreme_counter = 0;
      }
      else if (multi == 0)
      {
        gpstime_diff = ic_gpstime->decompress(last_gpstime_diff/4, 2);
        multi_extreme_counter++;
        if (multi_extreme_counter > 3)
        {
          last_gpstime_diff = gpstime_diff;
          multi_extreme_counter = 0;
        }
      }
      else if (multi < 10)
      {
        gpstime_diff = ic_gpstime->decompress(multi*last_gpstime_diff, 3);
      }
      else if (multi < 50)
      {
        gpstime_diff = ic_gpstime->decompress(multi*last_gpstime_diff, 4);
      }
      else
      {
        gpstime_diff = ic_gpstime->decompress(multi*last_gpstime_diff, 5);
        if (multi == LASZIP_GPSTIME_MULTIMAX-3)
        {
          multi_extreme_counter++;
          if (multi_extreme_counter > 3)
          {
            last_gpstime_diff = gpstime_diff;
            multi_extreme_counter = 0;
          }
        }
      }
      last_gpstime.i64 += gpstime_diff;
    }
    else if (multi <  LASZIP_GPSTIME_MULTIMAX-1)
    {
      last_gpstime.u64 = dec->readInt64();
    }
  }
  *((I64*)item) = last_gpstime.i64;
}